

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void Js::JavascriptArray::Unshift<unsigned_int,unsigned_int>
               (RecyclableObject *obj,uint *toIndex,uint start,uint end,ScriptContext *scriptContext
               )

{
  uint32 index;
  uint uVar1;
  BOOL BVar2;
  Var value;
  uint32 index_00;
  undefined1 local_60 [8];
  JsReentLock jsReentLock;
  
  local_60 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_60)->noJsReentrancy;
  ((ThreadContext *)local_60)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_60,obj);
  if (start < end) {
    uVar1 = *toIndex;
    jsReentLock._28_4_ = start;
    do {
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      index = end - 1;
      BVar2 = JavascriptOperators::HasItem(obj,index);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      index_00 = end + ~start + uVar1;
      *(bool *)((long)local_60 + 0x108) = true;
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      if (BVar2 == 0) {
        BVar2 = JavascriptOperators::DeleteItem
                          (obj,index_00,PropertyOperation_ThrowOnDeleteIfNotConfig);
        if (BVar2 == 0) {
          JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.unshift");
        }
        JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      }
      else {
        value = JavascriptOperators::GetItem(obj,index,scriptContext);
        BVar2 = JavascriptOperators::SetItem
                          (obj,obj,index_00,value,
                           (((((obj->type).ptr)->javascriptLibrary).ptr)->
                           super_JavascriptLibraryBase).scriptContext.ptr,
                           PropertyOperation_ThrowIfNotExtensible,0);
        if (BVar2 == 0) {
          JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.unshift");
        }
        JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      }
      *(bool *)((long)local_60 + 0x108) = true;
      end = index;
    } while ((uint)jsReentLock._28_4_ < index);
  }
  ((ThreadContext *)local_60)->noJsReentrancy = (bool)jsReentLock.m_arrayObject2._0_1_;
  return;
}

Assistant:

void JavascriptArray::Unshift(RecyclableObject* obj, const T& toIndex, P start, P end, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        typedef IndexTrace<T> index_trace;

        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.unshift"));
        if (start < end)
        {
            T newEnd = (end - start - 1);// newEnd - 1
            T dst = toIndex + newEnd;
            for (P i = end; i > start; --i)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, i - 1));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(obj, i - 1, scriptContext),
                        h.ThrowTypeErrorOnFailure(index_trace::SetItem(obj, dst, element, PropertyOperation_ThrowIfNotExtensible)));
                }
                else
                {
                    JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(index_trace::DeleteItem(obj, dst, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                }

                --dst;
            }
        }
    }